

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O0

size_t encoder_qp_read(char *buffer,size_t size,_Bool ateof,curl_mimepart *part)

{
  uchar uVar1;
  size_t sVar2;
  int iVar3;
  mime_encoder_state *st_00;
  size_t sStack_60;
  int i;
  size_t consumed;
  size_t len;
  char buf [4];
  int softlinebreak;
  size_t cursize;
  char *ptr;
  mime_encoder_state *st;
  curl_mimepart *part_local;
  size_t sStack_20;
  _Bool ateof_local;
  size_t size_local;
  char *buffer_local;
  
  st_00 = &part->encstate;
  _buf = 0;
  cursize = (size_t)buffer;
  sStack_20 = size;
  while( true ) {
    if ((part->encstate).bufend <= (part->encstate).bufbeg) {
      return _buf;
    }
    consumed = 1;
    sStack_60 = 1;
    len._0_1_ = (part->encstate).buf[(part->encstate).bufbeg];
    len._1_1_ = "0123456789ABCDEF"[(uint)(int)(char)len >> 4 & 0xf];
    len._2_1_ = "0123456789ABCDEF"[(int)(char)len & 0xf];
    uVar1 = ""[(byte)(part->encstate).buf[(part->encstate).bufbeg]];
    if (uVar1 != '\x01') {
      if (uVar1 == '\x02') {
        iVar3 = qp_lookahead_eol(st_00,ateof & 1,1);
        if (iVar3 == -1) {
          return _buf;
        }
        if (iVar3 != 0) {
          len._0_1_ = '=';
          consumed = 3;
        }
      }
      else if (uVar1 == '\x03') {
        iVar3 = qp_lookahead_eol(st_00,ateof & 1,0);
        sVar2 = consumed;
        if (iVar3 == -1) {
          return _buf;
        }
        if (iVar3 == 1) {
          consumed = consumed + 1;
          buf[sVar2 - 8] = '\n';
          sStack_60 = 2;
        }
        else {
          len._0_1_ = '=';
          consumed = 3;
        }
      }
      else {
        len._0_1_ = '=';
        consumed = 3;
      }
    }
    if (*(char *)((long)&consumed + consumed + 7) != '\n') {
      len._4_4_ = (uint)(0x4c < st_00->pos + consumed);
      if ((len._4_4_ == 0) && (st_00->pos + consumed == 0x4c)) {
        iVar3 = qp_lookahead_eol(st_00,ateof & 1,sStack_60);
        if (iVar3 == -1) {
          return _buf;
        }
        if (iVar3 == 0) {
          len._4_4_ = 1;
        }
      }
      if (len._4_4_ != 0) {
        strcpy((char *)&len,"=\r\n");
        consumed = 3;
        sStack_60 = 0;
      }
    }
    if (sStack_20 < consumed) break;
    memcpy((void *)cursize,&len,consumed);
    _buf = _buf + consumed;
    cursize = consumed + cursize;
    sStack_20 = sStack_20 - consumed;
    st_00->pos = consumed + st_00->pos;
    if (*(char *)((long)&consumed + consumed + 7) == '\n') {
      st_00->pos = 0;
    }
    (part->encstate).bufbeg = sStack_60 + (part->encstate).bufbeg;
  }
  return _buf;
}

Assistant:

static size_t encoder_qp_read(char *buffer, size_t size, bool ateof,
                              curl_mimepart *part)
{
  mime_encoder_state *st = &part->encstate;
  char *ptr = buffer;
  size_t cursize = 0;
  int softlinebreak;
  char buf[4];

  /* On all platforms, input is supposed to be ASCII compatible: for this
     reason, we use hexadecimal ASCII codes in this function rather than
     character constants that can be interpreted as non-ascii on some
     platforms. Preserve ASCII encoding on output too. */
  while(st->bufbeg < st->bufend) {
    size_t len = 1;
    size_t consumed = 1;
    int i = st->buf[st->bufbeg];
    buf[0] = (char) i;
    buf[1] = aschex[(i >> 4) & 0xF];
    buf[2] = aschex[i & 0xF];

    switch(qp_class[st->buf[st->bufbeg] & 0xFF]) {
    case QP_OK:          /* Not a special character. */
      break;
    case QP_SP:          /* Space or tab. */
      /* Spacing must be escaped if followed by CRLF. */
      switch(qp_lookahead_eol(st, ateof, 1)) {
      case -1:          /* More input data needed. */
        return cursize;
      case 0:           /* No encoding needed. */
        break;
      default:          /* CRLF after space or tab. */
        buf[0] = '\x3D';    /* '=' */
        len = 3;
        break;
      }
      break;
    case QP_CR:         /* Carriage return. */
      /* If followed by a line-feed, output the CRLF pair.
         Else escape it. */
      switch(qp_lookahead_eol(st, ateof, 0)) {
      case -1:          /* Need more data. */
        return cursize;
      case 1:           /* CRLF found. */
        buf[len++] = '\x0A';    /* Append '\n'. */
        consumed = 2;
        break;
      default:          /* Not followed by LF: escape. */
        buf[0] = '\x3D';    /* '=' */
        len = 3;
        break;
      }
      break;
    default:            /* Character must be escaped. */
      buf[0] = '\x3D';    /* '=' */
      len = 3;
      break;
    }

    /* Be sure the encoded character fits within maximum line length. */
    if(buf[len - 1] != '\x0A') {    /* '\n' */
      softlinebreak = st->pos + len > MAX_ENCODED_LINE_LENGTH;
      if(!softlinebreak && st->pos + len == MAX_ENCODED_LINE_LENGTH) {
        /* We may use the current line only if end of data or followed by
           a CRLF. */
        switch(qp_lookahead_eol(st, ateof, consumed)) {
        case -1:        /* Need more data. */
          return cursize;
          break;
        case 0:         /* Not followed by a CRLF. */
          softlinebreak = 1;
          break;
        }
      }
      if(softlinebreak) {
        strcpy(buf, "\x3D\x0D\x0A");    /* "=\r\n" */
        len = 3;
        consumed = 0;
      }
    }

    /* If the output buffer would overflow, do not store. */
    if(len > size)
      break;

    /* Append to output buffer. */
    memcpy(ptr, buf, len);
    cursize += len;
    ptr += len;
    size -= len;
    st->pos += len;
    if(buf[len - 1] == '\x0A')    /* '\n' */
      st->pos = 0;
    st->bufbeg += consumed;
  }

  return cursize;
}